

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cc
# Opt level: O1

void io::uci::parsePosition(string *input,Board *pos)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  istream *piVar5;
  Move move;
  string moveString;
  istringstream ss;
  Move local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_130 [264];
  
  lVar2 = std::__cxx11::string::find((char *)input,0x137572,0);
  lVar3 = std::__cxx11::string::find((char *)input,0x13c02f,0);
  lVar4 = std::__cxx11::string::find((char *)input,0x13c034,0);
  if (lVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,board::Board::DEFAULT_FEN,(allocator<char> *)&local_1c8);
    board::Board::parseFen(pos,local_1a8);
  }
  else {
    if (lVar3 == -1) goto LAB_00131960;
    if (lVar4 == -1) {
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
      board::Board::parseFen(pos,local_1a8);
    }
    else {
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)input);
      board::Board::parseFen(pos,local_1a8);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
LAB_00131960:
  if (lVar4 != -1) {
    local_1d0.value = 0;
    local_1d0.score = 0;
    std::__cxx11::string::substr((ulong)&local_1c8,(ulong)input);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1a8,(string *)&local_1c8,_S_in);
    paVar1 = &local_1c8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    local_1c8._M_string_length = 0;
    local_1c8.field_2._M_local_buf[0] = '\0';
    local_1c8._M_dataplus._M_p = (pointer)paVar1;
    while( true ) {
      piVar5 = std::operator>>((istream *)local_1a8,(string *)&local_1c8);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      local_1d0 = parseMove(&local_1c8,pos);
      board::makemove::move(&local_1d0,pos);
    }
    pos->ply = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1c8._M_dataplus._M_p,
                      CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                               local_1c8.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
    std::ios_base::~ios_base(local_130);
  }
  board::Board::print(pos);
  return;
}

Assistant:

void io::uci::parsePosition(const std::string& input, board::Board& pos)
{
    size_t indexStartpos = input.find("startpos");
    size_t indexFen = input.find("fen ");
    size_t indexMoves = input.find("moves ");
    if (indexStartpos == 0) {
        pos.parseFen(board::Board::DEFAULT_FEN);
    }
    else if (indexFen != std::string::npos) {
        if (indexMoves != std::string::npos) {
            pos.parseFen(input.substr(indexFen + 4));
        }
        else {
            pos.parseFen(input.substr(indexFen + 4, indexMoves - 5));
        }
    }
    if (indexMoves != std::string::npos) {
        board::Move move;
        std::istringstream ss(input.substr(indexMoves + 6));
        std::string moveString;
        while (ss >> moveString) {
            move = io::parseMove(moveString, pos);
            board::makemove::move(move, pos);
        }
        pos.resetPly();
    }
    pos.print();
}